

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_frommesh.cpp
# Opt level: O0

uint __thiscall ON_NgonBoundaryComponent::IsBoundaryVertex(ON_NgonBoundaryComponent *this)

{
  bool bVar1;
  bool local_11;
  ON_NgonBoundaryComponent *this_local;
  
  local_11 = false;
  if ((this->m_type == Vertex) && (local_11 = false, this->m_face_count == '\0')) {
    bVar1 = Internal_IsAttachedToTwo(this,Edge);
    local_11 = false;
    if ((bVar1) && (local_11 = false, this->m_attached_to[0]->m_face_count == '\x01')) {
      local_11 = this->m_attached_to[1]->m_face_count == '\x01';
    }
  }
  return (uint)local_11;
}

Assistant:

unsigned int ON_NgonBoundaryComponent::IsBoundaryVertex() const
{
  return
    ON_NgonBoundaryComponent::Type::Vertex == m_type
    && 0 == m_face_count
    && Internal_IsAttachedToTwo(ON_NgonBoundaryComponent::Type::Edge)
    && 1 == m_attached_to[0]->m_face_count
    && 1 == m_attached_to[1]->m_face_count
    ;
}